

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::Buffer(Buffer *this,Buffer *that)

{
  Buffer *that_local;
  Buffer *this_local;
  
  this->buffer_ = (char *)0x0;
  this->leftIndex_ = 0;
  this->rightIndex_ = 0;
  this->capacity_ = 0;
  deepCopy(this,that);
  return;
}

Assistant:

Buffer::Buffer(Buffer &that) { deepCopy(that); }